

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::UpdateImpl(cmCTestGIT *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  undefined1 local_128 [8];
  OutputLogger submodule_err;
  OutputLogger submodule_out;
  char *git_submodule [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char *local_48;
  char *recursive;
  char *git;
  string top_dir;
  cmCTestGIT *this_local;
  
  top_dir.field_2._8_8_ = this;
  bVar1 = UpdateInternal(this);
  if (bVar1) {
    FindTopDir_abi_cxx11_((string *)&git,this);
    recursive = (char *)std::__cxx11::string::c_str();
    local_48 = "--recursive";
    uVar2 = GetGitVersion(this);
    uVar3 = cmCTestGITVersion(1,6,5,0);
    if (uVar2 < uVar3) {
      local_48 = (char *)0x0;
      std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&git,
                     "/.gitmodules");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::FileExists(pcVar4);
      std::__cxx11::string::~string((string *)&local_78);
      if (bVar1) {
        std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                        "Git < 1.6.5.0 cannot update submodules recursively\n");
      }
    }
    submodule_out.super_LineParser._56_8_ = recursive;
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)&submodule_err.super_LineParser.Separator,
               (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"submodule-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)local_128,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "submodule-err> ");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ =
         cmCTestVC::RunChild((cmCTestVC *)this,(char **)&submodule_out.super_LineParser.Separator,
                             (OutputParser *)&submodule_err.super_LineParser.Separator,
                             (OutputParser *)local_128,pcVar4);
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_128);
    cmProcessTools::OutputLogger::~OutputLogger
              ((OutputLogger *)&submodule_err.super_LineParser.Separator);
    std::__cxx11::string::~string((string *)&git);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestGIT::UpdateImpl()
{
  if(!this->UpdateInternal())
    {
    return false;
    }

  std::string top_dir = this->FindTopDir();
  const char* git = this->CommandLineTool.c_str();
  const char* recursive = "--recursive";

  // Git < 1.6.5.0 did not support --recursive
  if(this->GetGitVersion() < cmCTestGITVersion(1,6,5,0))
    {
    recursive = 0;
    // No need to require >= 1.6.5.0 if there are no submodules.
    if(cmSystemTools::FileExists((top_dir + "/.gitmodules").c_str()))
      {
      this->Log << "Git < 1.6.5.0 cannot update submodules recursively\n";
      }
    }

  char const* git_submodule[] = {git, "submodule", "update", recursive, 0};
  OutputLogger submodule_out(this->Log, "submodule-out> ");
  OutputLogger submodule_err(this->Log, "submodule-err> ");
  return this->RunChild(git_submodule, &submodule_out, &submodule_err,
                        top_dir.c_str());
}